

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O1

int genaSubscribe(UpnpClient_Handle client_handle,UpnpString *PublisherURL,int *TimeOut,
                 UpnpString *out_sid)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  uint uVar3;
  GenlibClientSubscription *p;
  UpnpString *sid;
  UpnpString *p_00;
  int iVar4;
  Handle_Info **ppHVar5;
  int *piVar6;
  Handle_Info *handle_info;
  Upnp_SID temp_sid2;
  Upnp_SID temp_sid;
  uuid_upnp uid;
  Handle_Info *local_b0;
  char local_a8 [48];
  char local_78 [56];
  uuid_upnp local_40;
  
  p = GenlibClientSubscription_new();
  sid = UpnpString_new();
  p_00 = UpnpString_new();
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0x20] = '\0';
  local_a8[0x21] = '\0';
  local_a8[0x22] = '\0';
  local_a8[0x23] = '\0';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = '\0';
  local_a8[0x27] = '\0';
  local_a8[0x28] = '\0';
  local_a8[0x29] = '\0';
  local_a8[0x2a] = '\0';
  local_a8[0x2b] = '\0';
  iVar4 = 2;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x24b,"GENA SUBSCRIBE BEGIN\n");
  UpnpString_clear(out_sid);
  HandleReadLock((char *)0x24f,iVar4);
  ppHVar5 = &local_b0;
  UVar1 = GetHandleInfo(client_handle,ppHVar5);
  if (UVar1 == HND_CLIENT) {
    HandleUnlock((char *)0x256,(int)ppHVar5);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x259,"Trying Subscribe Lock");
    pthread_mutex_lock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x259,"Subscribe Lock");
    piVar6 = TimeOut;
    uVar2 = gena_subscribe(PublisherURL,TimeOut,(UpnpString *)0x0,sid);
    HandleLock((char *)0x25b,(int)piVar6);
    if (uVar2 == 0) {
      ppHVar5 = &local_b0;
      UVar1 = GetHandleInfo(client_handle,ppHVar5);
      iVar4 = (int)ppHVar5;
      uVar2 = 0xffffff9c;
      if (UVar1 == HND_CLIENT) {
        uuid_create(&local_40);
        upnp_uuid_unpack(&local_40,local_78);
        iVar4 = 0x2c;
        uVar3 = snprintf(local_a8,0x2c,"uuid:%s",local_78);
        uVar2 = 0xffffff98;
        if (uVar3 < 0x2c) {
          UpnpString_set_String(out_sid,local_a8);
          UpnpString_assign(p_00,PublisherURL);
          iVar4 = (int)PublisherURL;
          if (p != (GenlibClientSubscription *)0x0) {
            GenlibClientSubscription_set_RenewEventId(p,-1);
            GenlibClientSubscription_set_SID(p,out_sid);
            GenlibClientSubscription_set_ActualSID(p,sid);
            GenlibClientSubscription_set_EventURL(p,p_00);
            GenlibClientSubscription_set_Next(p,local_b0->ClientSubList);
            local_b0->ClientSubList = p;
            iVar4 = *TimeOut;
            uVar2 = ScheduleGenaAutoRenew(client_handle,iVar4,p);
          }
        }
      }
    }
    else {
      iVar4 = 2;
      UpnpPrintf(UPNP_CRITICAL,GENA,".upnp/src/gena/gena_ctrlpt.c",0x260,
                 "SUBSCRIBE FAILED in transfer error code: %d returned\n",(ulong)uVar2);
    }
  }
  else {
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x253,"Trying Subscribe Lock");
    pthread_mutex_lock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    iVar4 = 2;
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x253,"Subscribe Lock");
    uVar2 = 0xffffff9c;
  }
  UpnpString_delete(sid);
  UpnpString_delete(p_00);
  if (uVar2 != 0) {
    GenlibClientSubscription_delete(p);
  }
  HandleUnlock((char *)0x28f,iVar4);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x290,"Trying Subscribe UnLock");
  pthread_mutex_unlock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x290,"Subscribe UnLock");
  return uVar2;
}

Assistant:

int genaSubscribe(UpnpClient_Handle client_handle,
	const UpnpString *PublisherURL,
	int *TimeOut,
	UpnpString *out_sid)
{
	int return_code = GENA_SUCCESS;
	GenlibClientSubscription *newSubscription =
		GenlibClientSubscription_new();
	uuid_upnp uid;
	Upnp_SID temp_sid;
	Upnp_SID temp_sid2;
	UpnpString *ActualSID = UpnpString_new();
	UpnpString *EventURL = UpnpString_new();
	struct Handle_Info *handle_info;
	int rc = 0;

	memset(temp_sid, 0, sizeof(temp_sid));
	memset(temp_sid2, 0, sizeof(temp_sid2));

	UpnpPrintf(
		UPNP_INFO, GENA, __FILE__, __LINE__, "GENA SUBSCRIBE BEGIN\n");

	UpnpString_clear(out_sid);

	HandleReadLock(__FILE__, __LINE__);
	/* validate handle */
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		return_code = GENA_E_BAD_HANDLE;
		SubscribeLock();
		goto error_handler;
	}
	HandleUnlock(__FILE__, __LINE__);

	/* subscribe */
	SubscribeLock();
	return_code = gena_subscribe(PublisherURL, TimeOut, NULL, ActualSID);
	HandleLock(__FILE__, __LINE__);
	if (return_code != UPNP_E_SUCCESS) {
		UpnpPrintf(UPNP_CRITICAL,
			GENA,
			__FILE__,
			__LINE__,
			"SUBSCRIBE FAILED in transfer error code: %d "
			"returned\n",
			return_code);
		goto error_handler;
	}

	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		return_code = GENA_E_BAD_HANDLE;
		goto error_handler;
	}

	/* generate client SID */
	uuid_create(&uid);
	upnp_uuid_unpack(&uid, temp_sid);
	rc = snprintf(temp_sid2, sizeof(temp_sid2), "uuid:%s", temp_sid);
	if (rc < 0 || (unsigned int)rc >= sizeof(temp_sid2)) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto error_handler;
	}
	UpnpString_set_String(out_sid, temp_sid2);

	/* create event url */
	UpnpString_assign(EventURL, PublisherURL);

	/* fill subscription */
	if (newSubscription == NULL) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto error_handler;
	}
	GenlibClientSubscription_set_RenewEventId(newSubscription, -1);
	GenlibClientSubscription_set_SID(newSubscription, out_sid);
	GenlibClientSubscription_set_ActualSID(newSubscription, ActualSID);
	GenlibClientSubscription_set_EventURL(newSubscription, EventURL);
	GenlibClientSubscription_set_Next(
		newSubscription, handle_info->ClientSubList);
	handle_info->ClientSubList = newSubscription;

	/* schedule expiration event */
	return_code =
		ScheduleGenaAutoRenew(client_handle, *TimeOut, newSubscription);

error_handler:
	UpnpString_delete(ActualSID);
	UpnpString_delete(EventURL);
	if (return_code != UPNP_E_SUCCESS)
		GenlibClientSubscription_delete(newSubscription);
	HandleUnlock(__FILE__, __LINE__);
	SubscribeUnlock();

	return return_code;
}